

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::GetGlslInsts(GraphicsRobustAccessPass *this)

{
  undefined1 *args_3;
  Module *pMVar1;
  FeatureManager *__ptr;
  Pass *pPVar2;
  int iVar3;
  uint32_t uVar4;
  Operand *this_00;
  size_t sVar5;
  uint uVar6;
  Instruction *pIVar7;
  uint uVar8;
  IRContext *pIVar9;
  size_t byte_index;
  _func_int **pp_Var10;
  Instruction *inst;
  Instruction *pIVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  char glsl [13];
  uint32_t word;
  Instruction *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  char local_c0 [16];
  Pass *local_b0;
  undefined1 local_a8 [24];
  uint local_90 [2];
  uint *local_88;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  int local_78 [2];
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  IRContext *local_48;
  initializer_list<spvtools::opt::Operand> local_40;
  
  if (*(uint32_t *)&this->field_0x38 != 0) {
    return *(uint32_t *)&this->field_0x38;
  }
  args_3 = &this->field_0x38;
  builtin_strncpy(local_c0 + 8,".450",5);
  builtin_strncpy(local_c0,"GLSL.std",8);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar11 = *(Instruction **)
             ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  pIVar7 = (Instruction *)
           ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_b0 = &this->super_Pass;
  if (pIVar11 != pIVar7) {
    do {
      this_00 = Instruction::GetInOperand(pIVar11,0);
      Operand::AsString_abi_cxx11_((string *)local_a8,this_00);
      iVar3 = std::__cxx11::string::compare((char *)local_a8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if (iVar3 == 0) {
        uVar4 = 0;
        if (pIVar11->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
        }
        *(uint32_t *)args_3 = uVar4;
      }
      pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar11 != pIVar7);
    if (*(uint32_t *)args_3 != 0) {
      return *(uint32_t *)args_3;
    }
  }
  pPVar2 = local_b0;
  uVar4 = Pass::TakeNextId(local_b0);
  *(uint32_t *)&pPVar2[1]._vptr_Pass = uVar4;
  local_a8._0_8_ = local_a8 + 0x10;
  sVar5 = strlen(local_c0);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_c0,local_c0 + sVar5);
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_70._0_4_ = 0;
  pp_Var10 = (_func_int **)0x0;
  do {
    uVar6 = 0;
    if (pp_Var10 < (ulong)local_a8._8_8_) {
      uVar6 = (uint)*(byte *)(local_a8._0_8_ + (long)pp_Var10);
    }
    uVar8 = (uint)pp_Var10 & 3;
    local_70._0_4_ = local_70._0_4_ | uVar6 << (char)uVar8 * '\b';
    if (uVar8 == 3) {
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_70);
      }
      else {
        *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_70._0_4_;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_70._0_4_ = 0;
    }
    pp_Var10 = (_func_int **)((long)pp_Var10 + 1);
  } while (pp_Var10 <= (ulong)local_a8._8_8_);
  if (((int)local_a8._8_8_ + 1U & 3) != 0) {
    if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_70);
    }
    else {
      *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_70._0_4_;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_48 = pPVar2->context_;
  local_78[1] = 0xb;
  local_78[0] = 0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_70,&local_d8);
  local_a8._0_4_ = 0xb;
  local_a8._8_8_ = &PTR__SmallVector_00930a20;
  local_a8._16_8_ = 0;
  local_88 = local_90;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_70);
  local_40._M_array = (iterator)local_a8;
  local_40._M_len = 1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_e0,&local_48,(Op *)(local_78 + 1),local_78,(uint *)args_3,&local_40)
  ;
  local_a8._8_8_ = &PTR__SmallVector_00930a20;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._0_8_ = &PTR__SmallVector_00930a20;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_50._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_50._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  pPVar2 = local_b0;
  pIVar11 = local_e0;
  local_e0 = (Instruction *)0x0;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((local_b0->context_->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
              ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar11);
  pPVar2->field_0x34 = 1;
  pIVar9 = pPVar2->context_;
  if ((pIVar9->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar9->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar11);
    pIVar9 = pPVar2->context_;
  }
  __ptr = (pIVar9->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  (pIVar9->feature_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
       (FeatureManager *)0x0;
  if (__ptr != (FeatureManager *)0x0) {
    std::default_delete<spvtools::opt::FeatureManager>::operator()
              ((default_delete<spvtools::opt::FeatureManager> *)&pIVar9->feature_mgr_,__ptr);
  }
  if (local_e0 != (Instruction *)0x0) {
    (**(code **)(*(long *)local_e0 + 8))();
  }
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return *(uint32_t *)args_3;
}

Assistant:

uint32_t GraphicsRobustAccessPass::GetGlslInsts() {
  if (module_status_.glsl_insts_id == 0) {
    // This string serves double-duty as raw data for a string and for a vector
    // of 32-bit words
    const char glsl[] = "GLSL.std.450";
    // Use an existing import if we can.
    for (auto& inst : context()->module()->ext_inst_imports()) {
      if (inst.GetInOperand(0).AsString() == glsl) {
        module_status_.glsl_insts_id = inst.result_id();
      }
    }
    if (module_status_.glsl_insts_id == 0) {
      // Make a new import instruction.
      module_status_.glsl_insts_id = TakeNextId();
      std::vector<uint32_t> words = spvtools::utils::MakeVector(glsl);
      auto import_inst = MakeUnique<Instruction>(
          context(), spv::Op::OpExtInstImport, 0, module_status_.glsl_insts_id,
          std::initializer_list<Operand>{
              Operand{SPV_OPERAND_TYPE_LITERAL_STRING, std::move(words)}});
      Instruction* inst = import_inst.get();
      context()->module()->AddExtInstImport(std::move(import_inst));
      module_status_.modified = true;
      context()->AnalyzeDefUse(inst);
      // Invalidates the feature manager, since we added an extended instruction
      // set import.
      context()->ResetFeatureManager();
    }
  }
  return module_status_.glsl_insts_id;
}